

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  basic_buffer<char> *pbVar4;
  size_t sVar5;
  ulong __n;
  char *data;
  str_writer<char> local_40;
  
  __n = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    pbVar4 = (this->writer_).out_.container;
    sVar5 = pbVar4->size_;
    uVar1 = sVar5 + __n;
    if (pbVar4->capacity_ < uVar1) {
      (**pbVar4->_vptr_basic_buffer)(pbVar4,uVar1);
    }
    pbVar4->size_ = uVar1;
    if (__n != 0) {
      memmove(pbVar4->ptr_ + sVar5,value.data_,__n);
    }
  }
  else {
    cVar2 = (this->specs_->super_core_format_specs).type;
    if ((cVar2 != '\0') && (cVar2 != 's')) {
      error_handler::on_error((error_handler *)&local_40,"invalid type specifier");
    }
    uVar3 = (this->specs_->super_core_format_specs).precision;
    local_40.size_ = (ulong)uVar3;
    if (__n <= uVar3) {
      local_40.size_ = __n;
    }
    if ((int)uVar3 < 0) {
      local_40.size_ = __n;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                *)this,&this->specs_->super_align_spec,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }